

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O3

int pkcs7_bundle_crls_cb(CBB *out,void *arg)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  X509_CRL *a;
  size_t sVar4;
  uint uVar5;
  uint8_t *buf;
  CBB crl_data;
  uint8_t *local_68;
  CBB local_60;
  
  iVar1 = CBB_add_asn1(out,&local_60,0xa0000001);
  uVar5 = 0;
  if (iVar1 != 0) {
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)arg);
    if (sVar3 != 0) {
      sVar3 = 0;
      do {
        a = (X509_CRL *)OPENSSL_sk_value((OPENSSL_STACK *)arg,sVar3);
        uVar2 = i2d_X509_CRL(a,(uchar **)0x0);
        if ((((int)uVar2 < 0) ||
            (iVar1 = CBB_add_space(&local_60,&local_68,(ulong)uVar2), iVar1 == 0)) ||
           (iVar1 = i2d_X509_CRL(a,&local_68), iVar1 < 0)) {
          return 0;
        }
        sVar3 = sVar3 + 1;
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)arg);
      } while (sVar3 < sVar4);
    }
    iVar1 = CBB_flush_asn1_set_of(&local_60);
    if (iVar1 != 0) {
      iVar1 = CBB_flush(out);
      uVar5 = (uint)(iVar1 != 0);
    }
  }
  return uVar5;
}

Assistant:

static int pkcs7_bundle_crls_cb(CBB *out, void *arg) {
  auto *crls = static_cast<const STACK_OF(X509_CRL) *>(arg);
  size_t i;
  CBB crl_data;

  // See https://tools.ietf.org/html/rfc2315#section-9.1
  if (!CBB_add_asn1(out, &crl_data,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1)) {
    return 0;
  }

  for (i = 0; i < sk_X509_CRL_num(crls); i++) {
    X509_CRL *crl = sk_X509_CRL_value(crls, i);
    uint8_t *buf;
    int len = i2d_X509_CRL(crl, NULL);

    if (len < 0 || !CBB_add_space(&crl_data, &buf, len) ||
        i2d_X509_CRL(crl, &buf) < 0) {
      return 0;
    }
  }

  // |crl_data| is a implicitly-tagged SET OF.
  return CBB_flush_asn1_set_of(&crl_data) && CBB_flush(out);
}